

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocSaveStream(TidyDocImpl *doc,StreamOut *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  TidyConfigChangeCallback p_Var14;
  Bool BVar15;
  int iVar16;
  TidyConfigChangeCallback callback;
  TidyAttrSortStrategy sortAttrStrat;
  Bool ppWithTabs;
  Bool escapeCDATA;
  Bool makeBare;
  Bool asciiChars;
  Bool makeClean;
  Bool dropComments;
  TidyTriState bodyOnly;
  Bool xhtmlOut;
  Bool xmlOut;
  Bool smartBOM;
  Bool outputBOM;
  Bool forceOutput;
  Bool showMarkup;
  StreamOut *out_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x4c].v;
  uVar2 = (doc->config).value[0x1e].v;
  uVar3 = (doc->config).value[0x3e].v;
  uVar4 = (doc->config).value[0x3e].v;
  uVar5 = (doc->config).value[100].v;
  uVar6 = (doc->config).value[0x62].v;
  uVar7 = (doc->config).value[6].v;
  uVar8 = (doc->config).value[0x20].v;
  uVar9 = (doc->config).value[0x30].v;
  uVar10 = (doc->config).value[4].v;
  iVar16 = (int)(doc->config).value[0x2f].v;
  uVar11 = (doc->config).value[0x19].v;
  uVar12 = (doc->config).value[0x3f].v;
  uVar13 = (doc->config).value[0x50].v;
  p_Var14 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if ((int)uVar12 == 0) {
    prvTidyPPrintSpaces();
  }
  else {
    prvTidyPPrintTabs();
  }
  if ((int)uVar11 != 0) {
    prvTidyConvertCDATANodes(doc,&doc->root);
  }
  if ((int)uVar8 != 0) {
    prvTidyDropComments(doc,&doc->root);
  }
  if ((((int)uVar9 != 0) && (prvTidyDropFontElements(doc,&doc->root,(Node **)0x0), (int)uVar10 != 0)
      ) || (iVar16 != 0)) {
    prvTidyDowngradeTypography(doc,&doc->root);
  }
  if (iVar16 == 0) {
    prvTidyReplacePreformattedSpaces(doc,&doc->root);
  }
  else {
    prvTidyNormalizeSpaces(doc->lexer,&doc->root);
  }
  prvTidySortAttributes(doc,&doc->root,(TidyAttrSortStrategy)uVar13);
  if (((int)uVar1 != 0) && ((doc->errors == 0 || ((int)uVar2 != 0)))) {
    if (((int)uVar3 == 1) || ((doc->inputHadBOM != no && ((int)uVar4 == 2)))) {
      prvTidyoutBOM(out);
    }
    doc->docOut = out;
    if (((int)uVar5 == 0) || ((int)uVar6 != 0)) {
      BVar15 = showBodyOnly(doc,(TidyTriState)uVar7);
      if (BVar15 == no) {
        prvTidyPPrintTree(doc,0,0,&doc->root);
      }
      else {
        prvTidyPrintBody(doc);
      }
    }
    else {
      prvTidyPPrintXMLTree(doc,0,0,&doc->root);
    }
    prvTidyPFlushLine(doc,0);
    doc->docOut = (StreamOut *)0x0;
  }
  prvTidyResetConfigToSnapshot(doc);
  doc->pConfigChangeCallback = p_Var14;
  iVar16 = tidyDocStatus(doc);
  return iVar16;
}

Assistant:

int         tidyDocSaveStream( TidyDocImpl* doc, StreamOut* out )
{
    Bool showMarkup  = cfgBool( doc, TidyShowMarkup );
    Bool forceOutput = cfgBool( doc, TidyForceOutput );
    Bool outputBOM   = ( cfgAutoBool(doc, TidyOutputBOM) == TidyYesState );
    Bool smartBOM    = ( cfgAutoBool(doc, TidyOutputBOM) == TidyAutoState );
    Bool xmlOut      = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut    = cfgBool( doc, TidyXhtmlOut );
    TidyTriState bodyOnly    = cfgAutoBool( doc, TidyBodyOnly );

    Bool dropComments = cfgBool(doc, TidyHideComments);
    Bool makeClean    = cfgBool(doc, TidyMakeClean);
    Bool asciiChars   = cfgBool(doc, TidyAsciiChars);
    Bool makeBare     = cfgBool(doc, TidyMakeBare);
    Bool escapeCDATA  = cfgBool(doc, TidyEscapeCdata);
    Bool ppWithTabs   = cfgBool(doc, TidyPPrintTabs);
    TidyAttrSortStrategy sortAttrStrat = cfg(doc, TidySortAttributes);
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    doc->pConfigChangeCallback = NULL;

    if (ppWithTabs)
        TY_(PPrintTabs)();
    else
        TY_(PPrintSpaces)();

    if (escapeCDATA)
        TY_(ConvertCDATANodes)(doc, &doc->root);

    if (dropComments)
        TY_(DropComments)(doc, &doc->root);

    if (makeClean)
    {
        /* noop */
        TY_(DropFontElements)(doc, &doc->root, NULL);
    }

    if ((makeClean && asciiChars) || makeBare)
        TY_(DowngradeTypography)(doc, &doc->root);

    if (makeBare)
        /* Note: no longer replaces &nbsp; in */
        /* attribute values / non-text tokens */
        TY_(NormalizeSpaces)(doc->lexer, &doc->root);
    else
        TY_(ReplacePreformattedSpaces)(doc, &doc->root);

    TY_(SortAttributes)(doc, &doc->root, sortAttrStrat);

    if ( showMarkup && (doc->errors == 0 || forceOutput) )
    {
        /* Output a Byte Order Mark if required */
        if ( outputBOM || (doc->inputHadBOM && smartBOM) )
            TY_(outBOM)( out );

        /* No longer necessary. No DOCTYPE == HTML 3.2,
        ** which gives you only the basic character entities,
        ** which are safe in any browser.
        ** if ( !TY_(FindDocType)(doc) )
        **    TY_(SetOptionBool)( doc, TidyNumEntities, yes );
        */

        doc->docOut = out;
        if ( xmlOut && !xhtmlOut )
            TY_(PPrintXMLTree)( doc, NORMAL, 0, &doc->root );
        else if ( showBodyOnly( doc, bodyOnly ) )
            TY_(PrintBody)( doc );
        else
            TY_(PPrintTree)( doc, NORMAL, 0, &doc->root );

        TY_(PFlushLine)( doc, 0 );
        doc->docOut = NULL;
    }

    TY_(ResetConfigToSnapshot)( doc );
    doc->pConfigChangeCallback = callback;
    
    return tidyDocStatus( doc );
}